

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

void * __thiscall duckdb_re2::Prog::PrefixAccel_ShiftDFA(Prog *this,void *data,size_t size)

{
  ulong uVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint64_t *puVar11;
  ulong uVar12;
  
  uVar1 = this->prefix_size_;
  if (size < uVar1) {
    return (void *)0x0;
  }
  if (size < 8) {
    puVar11 = (this->field_11).prefix_dfa_;
    uVar6 = 0;
  }
  else {
    pbVar2 = (byte *)((size & 0xfffffffffffffff8) + (long)data);
    puVar11 = (this->field_11).prefix_dfa_;
    uVar6 = 0;
    do {
      uVar12 = puVar11[*data] >> ((byte)uVar6 & 0x3f);
      uVar3 = puVar11[*(byte *)((long)data + 1)] >> ((byte)uVar12 & 0x3f);
      uVar10 = puVar11[*(byte *)((long)data + 2)] >> ((byte)uVar3 & 0x3f);
      uVar9 = puVar11[*(byte *)((long)data + 3)] >> ((byte)uVar10 & 0x3f);
      uVar8 = puVar11[*(byte *)((long)data + 4)] >> ((byte)uVar9 & 0x3f);
      uVar7 = puVar11[*(byte *)((long)data + 5)] >> ((byte)uVar8 & 0x3f);
      uVar4 = puVar11[*(byte *)((long)data + 6)] >> ((byte)uVar7 & 0x3f);
      uVar6 = puVar11[*(byte *)((long)data + 7)] >> ((byte)uVar4 & 0x3f);
      if (((uint)uVar6 & 0x3f) == 0x36) {
        if ((0x36U - (int)uVar12 & 0x3f) == 0) {
          return (byte *)((long)data + (1 - uVar1));
        }
        if ((0x36U - (int)uVar3 & 0x3f) == 0) {
          return (byte *)((long)data + (2 - uVar1));
        }
        if ((0x36U - (int)uVar10 & 0x3f) == 0) {
          return (byte *)((long)data + (3 - uVar1));
        }
        if ((0x36U - (int)uVar9 & 0x3f) != 0) {
          if ((0x36U - (int)uVar8 & 0x3f) == 0) {
            return (byte *)((long)data + (5 - uVar1));
          }
          if ((0x36U - (int)uVar7 & 0x3f) != 0) {
            if ((0x36U - (int)uVar4 & 0x3f) != 0) {
              return (byte *)((long)data + (8 - uVar1));
            }
            return (byte *)((long)data + (7 - uVar1));
          }
          return (byte *)((long)data + (6 - uVar1));
        }
        return (byte *)((long)data + (4 - uVar1));
      }
      data = (void *)((long)data + 8);
    } while ((byte *)data != pbVar2);
    size = (size_t)((uint)size & 7);
    data = pbVar2;
  }
  sVar5 = 0;
  do {
    if (size == sVar5) {
      return (void *)0x0;
    }
    uVar6 = puVar11[*(byte *)((long)data + sVar5)] >> ((byte)uVar6 & 0x3f);
    sVar5 = sVar5 + 1;
  } while (((uint)uVar6 & 0x3f) != 0x36);
  return (byte *)((long)data + (sVar5 - uVar1));
}

Assistant:

const void* Prog::PrefixAccel_ShiftDFA(const void* data, size_t size) {
  if (size < prefix_size_)
    return NULL;

  uint64_t curr = 0;

  // At the time of writing, rough benchmarks on a Broadwell machine showed
  // that this unroll factor (i.e. eight) achieves a speedup factor of two.
  if (size >= 8) {
    const uint8_t* p = reinterpret_cast<const uint8_t*>(data);
    const uint8_t* endp = p + (size&~7);
    do {
      uint8_t b0 = p[0];
      uint8_t b1 = p[1];
      uint8_t b2 = p[2];
      uint8_t b3 = p[3];
      uint8_t b4 = p[4];
      uint8_t b5 = p[5];
      uint8_t b6 = p[6];
      uint8_t b7 = p[7];

      uint64_t next0 = prefix_dfa_[b0];
      uint64_t next1 = prefix_dfa_[b1];
      uint64_t next2 = prefix_dfa_[b2];
      uint64_t next3 = prefix_dfa_[b3];
      uint64_t next4 = prefix_dfa_[b4];
      uint64_t next5 = prefix_dfa_[b5];
      uint64_t next6 = prefix_dfa_[b6];
      uint64_t next7 = prefix_dfa_[b7];

      uint64_t curr0 = next0 >> (curr  & 63);
      uint64_t curr1 = next1 >> (curr0 & 63);
      uint64_t curr2 = next2 >> (curr1 & 63);
      uint64_t curr3 = next3 >> (curr2 & 63);
      uint64_t curr4 = next4 >> (curr3 & 63);
      uint64_t curr5 = next5 >> (curr4 & 63);
      uint64_t curr6 = next6 >> (curr5 & 63);
      uint64_t curr7 = next7 >> (curr6 & 63);

      if ((curr7 & 63) == kShiftDFAFinal * 6) {
        // At the time of writing, using the same masking subexpressions from
        // the preceding lines caused Clang to clutter the hot loop computing
        // them - even though they aren't actually needed for shifting! Hence
        // these rewritten conditions, which achieve a speedup factor of two.
        if (((curr7-curr0) & 63) == 0) return p+1-prefix_size_;
        if (((curr7-curr1) & 63) == 0) return p+2-prefix_size_;
        if (((curr7-curr2) & 63) == 0) return p+3-prefix_size_;
        if (((curr7-curr3) & 63) == 0) return p+4-prefix_size_;
        if (((curr7-curr4) & 63) == 0) return p+5-prefix_size_;
        if (((curr7-curr5) & 63) == 0) return p+6-prefix_size_;
        if (((curr7-curr6) & 63) == 0) return p+7-prefix_size_;
        if (((curr7-curr7) & 63) == 0) return p+8-prefix_size_;
      }

      curr = curr7;
      p += 8;
    } while (p != endp);
    data = p;
    size = size&7;
  }

  const uint8_t* p = reinterpret_cast<const uint8_t*>(data);
  const uint8_t* endp = p + size;
  while (p != endp) {
    uint8_t b = *p++;
    uint64_t next = prefix_dfa_[b];
    curr = next >> (curr & 63);
    if ((curr & 63) == kShiftDFAFinal * 6)
      return p-prefix_size_;
  }
  return NULL;
}